

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigIoa.c
# Opt level: O0

Aig_Obj_t * Saig_ManReadNode(Aig_Man_t *p,int *pNum2Id,char *pToken)

{
  int iVar1;
  int Num;
  char *pToken_local;
  int *pNum2Id_local;
  Aig_Man_t *p_local;
  
  if (*pToken == 'n') {
    iVar1 = atoi(pToken + 1);
    p_local = (Aig_Man_t *)Aig_ManObj(p,pNum2Id[iVar1]);
  }
  else if (*pToken == 'p') {
    if (pToken[1] == 'i') {
      iVar1 = atoi(pToken + 2);
      p_local = (Aig_Man_t *)Aig_ManCi(p,iVar1);
    }
    else {
      if (pToken[1] != 'o') {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigIoa.c"
                      ,0xd7,"Aig_Obj_t *Saig_ManReadNode(Aig_Man_t *, int *, char *)");
      }
      p_local = (Aig_Man_t *)0x0;
    }
  }
  else {
    if (*pToken != 'l') {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigIoa.c"
                    ,0xe7,"Aig_Obj_t *Saig_ManReadNode(Aig_Man_t *, int *, char *)");
    }
    if (pToken[1] == 'o') {
      iVar1 = atoi(pToken + 2);
      p_local = (Aig_Man_t *)Saig_ManLo(p,iVar1);
    }
    else {
      if (pToken[1] != 'i') {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigIoa.c"
                      ,0xe4,"Aig_Obj_t *Saig_ManReadNode(Aig_Man_t *, int *, char *)");
      }
      p_local = (Aig_Man_t *)0x0;
    }
  }
  return (Aig_Obj_t *)p_local;
}

Assistant:

Aig_Obj_t * Saig_ManReadNode( Aig_Man_t * p, int * pNum2Id, char * pToken )
{
    int Num;
    if ( pToken[0] == 'n' )
    {
        Num = atoi( pToken + 1 );
        return Aig_ManObj( p, pNum2Id[Num] );
    }
    if ( pToken[0] == 'p' )
    {
        pToken++;
        if ( pToken[0] == 'i' )
        {
            Num = atoi( pToken + 1 );
            return Aig_ManCi( p, Num );
        }
        if ( pToken[0] == 'o' )
            return NULL;
        assert( 0 );
        return NULL;
    }
    if ( pToken[0] == 'l' )
    {
        pToken++;
        if ( pToken[0] == 'o' )
        {
            Num = atoi( pToken + 1 );
            return Saig_ManLo( p, Num );
        }
        if ( pToken[0] == 'i' )
            return NULL;
        assert( 0 );
        return NULL;
    }
    assert( 0 );
    return NULL;
}